

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

double algdiv(double *a,double *b)

{
  double dVar1;
  double dVar2;
  double *b_local;
  double *a_local;
  
  if (*b < *a) {
    algdiv::h = *b / *a;
    algdiv::c = 1.0 / (algdiv::h + 1.0);
    algdiv::x = algdiv::h / (algdiv::h + 1.0);
    algdiv::d = *a + (*b - 0.5);
  }
  else {
    algdiv::h = *a / *b;
    algdiv::c = algdiv::h / (algdiv::h + 1.0);
    algdiv::x = 1.0 / (algdiv::h + 1.0);
    algdiv::d = *b + (*a - 0.5);
  }
  algdiv::x2 = algdiv::x * algdiv::x;
  algdiv::s3 = algdiv::x + algdiv::x2 + 1.0;
  algdiv::s5 = algdiv::x2 * algdiv::s3 + algdiv::x + 1.0;
  algdiv::s7 = algdiv::x2 * algdiv::s5 + algdiv::x + 1.0;
  algdiv::s9 = algdiv::x2 * algdiv::s7 + algdiv::x + 1.0;
  algdiv::s11 = algdiv::x2 * algdiv::s9 + algdiv::x + 1.0;
  algdiv::t = pow(1.0 / *b,2.0);
  dVar1 = algdiv::d;
  algdiv::w = (algdiv::c / *b) *
              (((((algdiv::c5 * algdiv::s11 * algdiv::t + algdiv::c4 * algdiv::s9) * algdiv::t +
                 algdiv::c3 * algdiv::s7) * algdiv::t + algdiv::c2 * algdiv::s5) * algdiv::t +
               algdiv::c1 * algdiv::s3) * algdiv::t + algdiv::c0);
  algdiv::T1 = *a / *b;
  dVar2 = alnrel(&algdiv::T1);
  algdiv::u = dVar1 * dVar2;
  dVar1 = *a;
  dVar2 = log(*b);
  algdiv::v = dVar1 * (dVar2 - 1.0);
  if (algdiv::v < algdiv::u) {
    a_local = (double *)((algdiv::w - algdiv::v) - algdiv::u);
  }
  else {
    a_local = (double *)((algdiv::w - algdiv::u) - algdiv::v);
  }
  algdiv::algdiv = (double)a_local;
  return (double)a_local;
}

Assistant:

double algdiv(double *a,double *b)
/*
-----------------------------------------------------------------------

     COMPUTATION OF LN(GAMMA(B)/GAMMA(A+B)) WHEN B .GE. 8

                         --------

     IN THIS ALGORITHM, DEL(X) IS THE FUNCTION DEFINED BY
     LN(GAMMA(X)) = (X - 0.5)*LN(X) - X + 0.5*LN(2*PI) + DEL(X).

-----------------------------------------------------------------------
*/
{
static double c0 = .833333333333333e-01;
static double c1 = -.277777777760991e-02;
static double c2 = .793650666825390e-03;
static double c3 = -.595202931351870e-03;
static double c4 = .837308034031215e-03;
static double c5 = -.165322962780713e-02;
static double algdiv,c,d,h,s11,s3,s5,s7,s9,t,u,v,w,x,x2,T1;
/*
     ..
     .. Executable Statements ..
*/
    if(*a <= *b) goto S10;
    h = *b/ *a;
    c = 1.0e0/(1.0e0+h);
    x = h/(1.0e0+h);
    d = *a+(*b-0.5e0);
    goto S20;
S10:
    h = *a/ *b;
    c = h/(1.0e0+h);
    x = 1.0e0/(1.0e0+h);
    d = *b+(*a-0.5e0);
S20:
/*
                SET SN = (1 - X**N)/(1 - X)
*/
    x2 = x*x;
    s3 = 1.0e0+(x+x2);
    s5 = 1.0e0+(x+x2*s3);
    s7 = 1.0e0+(x+x2*s5);
    s9 = 1.0e0+(x+x2*s7);
    s11 = 1.0e0+(x+x2*s9);
/*
                SET W = DEL(B) - DEL(A + B)
*/
    t = pow(1.0e0/ *b,2.0);
    w = ((((c5*s11*t+c4*s9)*t+c3*s7)*t+c2*s5)*t+c1*s3)*t+c0;
    w *= (c/ *b);
/*
                    COMBINE THE RESULTS
*/
    T1 = *a/ *b;
    u = d*alnrel(&T1);
    v = *a*(log(*b)-1.0e0);
    if(u <= v) goto S30;
    algdiv = w-v-u;
    return algdiv;
S30:
    algdiv = w-u-v;
    return algdiv;
}